

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

float Abc_BufComputeDep(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pNode;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  float local_2c;
  
  if ((pObj->vFanouts).nSize < 1) {
    local_2c = -1e+09;
  }
  else {
    local_2c = -1e+09;
    lVar6 = 0;
    do {
      pNode = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar6]];
      iVar1 = pNode->Id;
      lVar5 = (long)iVar1;
      if ((lVar5 < 0) || (p->vOffsets->nSize <= iVar1)) goto LAB_0045367e;
      if (p->vOffsets->pArray[lVar5] != -1000000000) {
        if (p->vDep->nSize <= iVar1) {
LAB_0045367e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = p->vDep->pArray[lVar5];
        iVar3 = Abc_NodeFindFanin(pNode,pObj);
        iVar2 = pNode->Id;
        if (((((long)iVar2 < 0) || (p->vOffsets->nSize <= iVar2)) ||
            (uVar4 = iVar3 + p->vOffsets->pArray[iVar2], (int)uVar4 < 0)) ||
           (p->vEdges->nSize <= (int)uVar4)) goto LAB_0045367e;
        fVar7 = (float)(iVar1 + p->vEdges->pArray[uVar4]);
        if (local_2c < fVar7) {
          local_2c = fVar7;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pObj->vFanouts).nSize);
  }
  iVar1 = pObj->Id;
  if ((-1 < (long)iVar1) && (iVar1 < p->vDep->nSize)) {
    p->vDep->pArray[iVar1] = (int)local_2c;
    return local_2c;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

float Abc_BufComputeDep( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    float DelayF, Delay = -ABC_INFINITY;
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        if ( Vec_IntEntry(p->vOffsets, Abc_ObjId(pFanout)) == -ABC_INFINITY )
            continue;
        DelayF = Abc_BufNodeDep(p, pFanout) + Abc_BufEdgeDelay(p, pFanout, Abc_NodeFindFanin(pFanout, pObj));
        if ( Delay < DelayF )
            Delay = DelayF;
    }
    Abc_BufSetNodeDep( p, pObj, Delay );
    return Delay;
}